

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::LogUnusedDependency
          (DescriptorBuilder *this,FileDescriptorProto *proto,FileDescriptor *result)

{
  iterator iVar1;
  undefined8 *puVar2;
  _Base_ptr p_Var3;
  int iVar4;
  long lVar5;
  long lVar6;
  string error_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  annotation_extensions;
  
  if ((this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    annotation_extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &annotation_extensions._M_t._M_impl.super__Rb_tree_header._M_header;
    annotation_extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    annotation_extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    annotation_extensions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    annotation_extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         annotation_extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string
              ((string *)&error_message,"google.protobuf.MessageOptions",(allocator *)&local_90);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&annotation_extensions,&error_message);
    std::__cxx11::string::~string((string *)&error_message);
    std::__cxx11::string::string
              ((string *)&error_message,"google.protobuf.FileOptions",(allocator *)&local_90);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&annotation_extensions,&error_message);
    std::__cxx11::string::~string((string *)&error_message);
    std::__cxx11::string::string
              ((string *)&error_message,"google.protobuf.FieldOptions",(allocator *)&local_90);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&annotation_extensions,&error_message);
    std::__cxx11::string::~string((string *)&error_message);
    std::__cxx11::string::string
              ((string *)&error_message,"google.protobuf.EnumOptions",(allocator *)&local_90);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&annotation_extensions,&error_message);
    std::__cxx11::string::~string((string *)&error_message);
    std::__cxx11::string::string
              ((string *)&error_message,"google.protobuf.EnumValueOptions",(allocator *)&local_90);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&annotation_extensions,&error_message);
    std::__cxx11::string::~string((string *)&error_message);
    std::__cxx11::string::string
              ((string *)&error_message,"google.protobuf.ServiceOptions",(allocator *)&local_90);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&annotation_extensions,&error_message);
    std::__cxx11::string::~string((string *)&error_message);
    std::__cxx11::string::string
              ((string *)&error_message,"google.protobuf.MethodOptions",(allocator *)&local_90);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&annotation_extensions,&error_message);
    std::__cxx11::string::~string((string *)&error_message);
    std::__cxx11::string::string
              ((string *)&error_message,"google.protobuf.StreamOptions",(allocator *)&local_90);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&annotation_extensions,&error_message);
    std::__cxx11::string::~string((string *)&error_message);
    for (p_Var3 = (this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      lVar5 = 0x58;
      lVar6 = 0;
      while( true ) {
        puVar2 = *(undefined8 **)(p_Var3 + 1);
        iVar4 = *(int *)(puVar2 + 0x11);
        if (iVar4 <= lVar6) break;
        iVar1 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&annotation_extensions._M_t,
                       *(key_type **)(*(long *)(puVar2[0x13] + lVar5) + 8));
        if ((_Rb_tree_header *)iVar1._M_node !=
            &annotation_extensions._M_t._M_impl.super__Rb_tree_header) {
          puVar2 = *(undefined8 **)(p_Var3 + 1);
          iVar4 = *(int *)(puVar2 + 0x11);
          break;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0xa8;
      }
      if (iVar4 == (int)lVar6) {
        std::operator+(&local_90,"Import ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar2)
        ;
        std::operator+(&error_message,&local_90," but not used.");
        std::__cxx11::string::~string((string *)&local_90);
        AddWarning(this,(string *)**(undefined8 **)(p_Var3 + 1),&proto->super_Message,OTHER,
                   &error_message);
        std::__cxx11::string::~string((string *)&error_message);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&annotation_extensions._M_t);
  }
  return;
}

Assistant:

void DescriptorBuilder::LogUnusedDependency(const FileDescriptorProto& proto,
                                            const FileDescriptor* result) {

  if (!unused_dependency_.empty()) {
    std::set<string> annotation_extensions;
    annotation_extensions.insert("google.protobuf.MessageOptions");
    annotation_extensions.insert("google.protobuf.FileOptions");
    annotation_extensions.insert("google.protobuf.FieldOptions");
    annotation_extensions.insert("google.protobuf.EnumOptions");
    annotation_extensions.insert("google.protobuf.EnumValueOptions");
    annotation_extensions.insert("google.protobuf.ServiceOptions");
    annotation_extensions.insert("google.protobuf.MethodOptions");
    annotation_extensions.insert("google.protobuf.StreamOptions");
    for (std::set<const FileDescriptor*>::const_iterator
             it = unused_dependency_.begin();
         it != unused_dependency_.end(); ++it) {
      // Do not log warnings for proto files which extend annotations.
      int i;
      for (i = 0 ; i < (*it)->extension_count(); ++i) {
        if (annotation_extensions.find(
                (*it)->extension(i)->containing_type()->full_name())
            != annotation_extensions.end()) {
          break;
        }
      }
      // Log warnings for unused imported files.
      if (i == (*it)->extension_count()) {
        string error_message = "Import " + (*it)->name() + " but not used.";
        AddWarning((*it)->name(), proto, DescriptorPool::ErrorCollector::OTHER,
                   error_message);
      }
    }
  }
}